

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::SamplePosQueryCase::init
          (SamplePosQueryCase *this,EVP_PKEY_CTX *ctx)

{
  RenderTarget *pRVar1;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  
  pRVar1 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar1->m_numSamples != 0) {
    return (int)pRVar1;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"No multisample buffers",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SamplePosQueryCase::init (void)
{
	if (m_context.getRenderTarget().getNumSamples() == 0)
		throw tcu::NotSupportedError("No multisample buffers");
}